

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclSize.c
# Opt level: O2

float Abc_SclCountNonBufferDelayInt(SC_Man *p,Abc_Obj_t *pObj)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  float fVar4;
  float fVar5;
  
  if (((*(uint *)&pObj->field_0x14 & 0xf) == 7) && ((pObj->vFanins).nSize == 1)) {
    uVar1 = (pObj->vFanouts).nSize;
    uVar2 = 0;
    uVar3 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar3 = uVar2;
    }
    fVar4 = 0.0;
    for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
      fVar5 = Abc_SclCountNonBufferDelayInt
                        (p,(Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanouts).pArray[uVar2]]);
      fVar4 = fVar4 + fVar5;
    }
  }
  else {
    fVar4 = p->pTimes[(uint)pObj->Id].rise;
    fVar5 = p->pTimes[(uint)pObj->Id].fall;
    if (fVar4 <= fVar5) {
      fVar4 = fVar5;
    }
  }
  return fVar4;
}

Assistant:

float Abc_SclCountNonBufferDelayInt( SC_Man * p, Abc_Obj_t * pObj )
{
    Abc_Obj_t * pFanout;
    float Delay = 0;
    int i; 
    if ( !Abc_ObjIsBuffer(pObj) )
        return Abc_SclObjTimeMax(p, pObj);
    Abc_ObjForEachFanout( pObj, pFanout, i )
        Delay += Abc_SclCountNonBufferDelayInt( p, pFanout );
    return Delay;
}